

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O2

bool __thiscall QLockFilePrivate::isApparentlyStale(QLockFilePrivate *this)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QDateTime lastMod;
  Data local_c8;
  QDateTime local_c0;
  QArrayDataPointer<char16_t> local_b8;
  LockFileInfo local_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.pid = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_98.appname.d.d = (Data *)0x0;
  local_98.appname.d.ptr = (char16_t *)0x0;
  local_98.appname.d.size = 0;
  local_98.hostname.d.d = (Data *)0x0;
  local_98.hostname.d.ptr = (char16_t *)0x0;
  local_98.hostname.d.size = 0;
  local_98.hostid.d.d = (Data *)0x0;
  local_98.hostid.d.ptr = (char *)0x0;
  local_98.hostid.d.size = 0;
  local_98.bootid.d.d = (Data *)0x0;
  local_98.bootid.d.ptr = (char *)0x0;
  local_98.bootid.d.size = 0;
  bVar2 = getLockInfo_helper(&this->fileName,&local_98);
  if (bVar2) {
    if (local_98.hostname.d.size == 0) {
      bVar2 = true;
    }
    else {
      QSysInfo::machineHostName();
      bVar2 = ::comparesEqual(&local_98.hostname,(QString *)&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    if (local_98.hostid.d.size != 0) {
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSysInfo::machineUniqueId();
      if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
        bVar2 = ::operator==((QByteArray *)&local_b8,&local_98.hostid);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
    }
    if (bVar2 != false) {
      if (local_98.bootid.d.size != 0) {
        QSysInfo::bootUniqueId();
        bVar2 = ::operator!=(&local_98.bootid,(QByteArray *)&local_b8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_b8);
        bVar5 = true;
        if (bVar2) goto LAB_0022ee9d;
      }
      bVar2 = isProcessRunning(local_98.pid,&local_98.appname);
      bVar5 = true;
      if (!bVar2) goto LAB_0022ee9d;
    }
  }
  local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_c0,&this->fileName);
  local_c8 = (Data)0x2;
  QFileInfo::lastModified((QFileInfo *)&local_b8,(QTimeZone *)&local_c0);
  QTimeZone::~QTimeZone((QTimeZone *)&local_c8.s);
  QFileInfo::~QFileInfo((QFileInfo *)&local_c0);
  QDateTime::currentDateTimeUtc();
  uVar3 = QDateTime::msecsTo((QDateTime *)&local_b8,&local_c0);
  QDateTime::~QDateTime(&local_c0);
  uVar1 = (this->staleLockTime).__r;
  uVar4 = -uVar3;
  if (0 < (long)uVar3) {
    uVar4 = uVar3;
  }
  bVar5 = uVar1 < uVar4 && 0 < (long)uVar1;
  QDateTime::~QDateTime((QDateTime *)&local_b8);
LAB_0022ee9d:
  anon_unknown.dwarf_389cec::LockFileInfo::~LockFileInfo(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFilePrivate::isApparentlyStale() const
{
    LockFileInfo info;
    if (getLockInfo_helper(fileName, &info)) {
        bool sameHost = info.hostname.isEmpty() || info.hostname == machineName();
        if (!info.hostid.isEmpty()) {
            // Override with the host ID, if we know it.
            QByteArray ourHostId = QSysInfo::machineUniqueId();
            if (!ourHostId.isEmpty())
                sameHost = (ourHostId == info.hostid);
        }

        if (sameHost) {
            if (!info.bootid.isEmpty()) {
                // If we've rebooted, then the lock is definitely stale.
                if (info.bootid != QSysInfo::bootUniqueId())
                    return true;
            }
            if (!isProcessRunning(info.pid, info.appname))
                return true;
        }
    }

    const QDateTime lastMod = QFileInfo(fileName).lastModified(QTimeZone::UTC);
    using namespace std::chrono;
    const milliseconds age{lastMod.msecsTo(QDateTime::currentDateTimeUtc())};
    return staleLockTime > 0ms && abs(age) > staleLockTime;
}